

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O1

void __thiscall CPU::ASL_AC(CPU *this)

{
  byte bVar1;
  byte bVar2;
  
  bVar1 = this->A;
  bVar2 = bVar1 * '\x02';
  this->A = bVar2;
  this->cycles = 1;
  (this->field_6).ps = bVar2 & 0x80 | (bVar2 == 0) * '\x02' | (this->field_6).ps & 0x7c | bVar1 >> 7
  ;
  return;
}

Assistant:

void CPU::ASL_AC()
{
    cycles = 2;
    C = (A & 0b10000000) > 0;
    A <<= 1;
    cycles--;
    Z = (A == 0);
    N = (A & 0b10000000) > 0;
}